

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_textedit_delete_selection(nk_text_edit *state)

{
  nk_text_edit *state_local;
  
  nk_textedit_clamp(state);
  if (state->select_start != state->select_end) {
    if (state->select_start < state->select_end) {
      nk_textedit_delete(state,state->select_start,state->select_end - state->select_start);
      state->cursor = state->select_start;
      state->select_end = state->select_start;
    }
    else {
      nk_textedit_delete(state,state->select_end,state->select_start - state->select_end);
      state->cursor = state->select_end;
      state->select_start = state->select_end;
    }
    state->has_preferred_x = '\0';
  }
  return;
}

Assistant:

NK_API void
nk_textedit_delete_selection(struct nk_text_edit *state)
{
    /* delete the section */
    nk_textedit_clamp(state);
    if (NK_TEXT_HAS_SELECTION(state)) {
        if (state->select_start < state->select_end) {
            nk_textedit_delete(state, state->select_start,
                state->select_end - state->select_start);
            state->select_end = state->cursor = state->select_start;
        } else {
            nk_textedit_delete(state, state->select_end,
                state->select_start - state->select_end);
            state->select_start = state->cursor = state->select_end;
        }
        state->has_preferred_x = 0;
    }
}